

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::EntryFinally(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Entry *object;
  RecyclableObject *pRVar7;
  RecyclableObject *pRVar8;
  JavascriptPromiseThenFinallyFunction *pJVar9;
  JavascriptPromiseThenFinallyFunction *pJVar10;
  JavascriptMethod p_Var11;
  int in_stack_00000010;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo local_50;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x38a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cef3fe;
    *puVar5 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_50);
  if ((local_50._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x38b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00cef3fe;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,local_50,L"Promise.prototype.finally",
             &stack0x00000000);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
LAB_00cef400:
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec41,L"Promise.prototype.finally");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar4 = JavascriptOperators::IsObject(pvVar6);
  if (BVar4 == 0) goto LAB_00cef400;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  object = (Entry *)UnsafeVarTo<Js::RecyclableObject>(pvVar6);
  pRVar7 = JavascriptOperators::SpeciesConstructor
                     ((RecyclableObject *)object,
                      &((((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).promiseConstructor.ptr)->
                       super_JavascriptFunction,pSVar1);
  bVar3 = JavascriptOperators::IsConstructor(pRVar7);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x39c,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar3) goto LAB_00cef3fe;
    *puVar5 = 0;
  }
  if (((ulong)callInfo_local & 0xfffffe) == 0) {
    pJVar9 = (JavascriptPromiseThenFinallyFunction *)
             (this->super_JavascriptLibraryBase).undefinedValue.ptr;
    pJVar10 = pJVar9;
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    bVar3 = JavascriptConversion::IsCallable(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
      pJVar9 = JavascriptLibrary::CreatePromiseThenFinallyFunction
                         (this,EntryThenFinallyFunction,pRVar8,pRVar7,false);
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
      pJVar10 = JavascriptLibrary::CreatePromiseThenFinallyFunction
                          (this,EntryThenFinallyFunction,pRVar8,pRVar7,true);
    }
    else {
      pJVar9 = (JavascriptPromiseThenFinallyFunction *)
               Arguments::operator[]((Arguments *)&callInfo_local,1);
      pJVar10 = (JavascriptPromiseThenFinallyFunction *)
                Arguments::operator[]((Arguments *)&callInfo_local,1);
    }
  }
  if ((pJVar9 == (JavascriptPromiseThenFinallyFunction *)0x0) ||
     (pJVar10 == (JavascriptPromiseThenFinallyFunction *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x3be,"(thenFinally != nullptr && catchFinally != nullptr)",
                                "thenFinally != nullptr && catchFinally != nullptr");
    if (!bVar3) {
LAB_00cef3fe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar6 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)object,0x169,pSVar1,(PropertyValueInfo *)0x0);
  bVar3 = JavascriptConversion::IsCallable(pvVar6);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"Promise.prototype.finally");
  }
  __tag.entry.next = object;
  pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
  this_00 = pSVar1->threadContext;
  bVar3 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
  if (pSVar1->threadContext->noJsReentrancy != true) {
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar7);
    CheckIsExecutable(pRVar7,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar7);
    pvVar6 = (*p_Var11)(pRVar7,(CallInfo)pRVar7,0x2000003,0,0,0,0,0x2000003,__tag.entry.next,pJVar9,
                        pJVar10);
    this_00->reentrancySafeOrHandled = bVar3;
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
    return pvVar6;
  }
  Throw::FatalJsReentrancyError();
}

Assistant:

Var JavascriptPromise::EntryFinally(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.prototype.finally"));
        // 1. Let promise be the this value
        // 2. If Type(promise) is not Object, throw a TypeError exception
        if (args.Info.Count < 1 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.prototype.finally"));
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        RecyclableObject* promise = UnsafeVarTo<RecyclableObject>(args[0]);
        // 3. Let C be ? SpeciesConstructor(promise, %Promise%).
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(promise, scriptContext->GetLibrary()->GetPromiseConstructor(), scriptContext);
        // 4. Assert IsConstructor(C)
        Assert(JavascriptOperators::IsConstructor(constructor));

        // 5. If IsCallable(onFinally) is false
        //   a. Let thenFinally be onFinally
        //   b. Let catchFinally be onFinally
        // 6. Else,
        //   a. Let thenFinally be a new built-in function object as defined in ThenFinally Function.
        //   b. Let catchFinally be a new built-in function object as defined in CatchFinally Function.
        //   c. Set thenFinally and catchFinally's [[Constructor]] internal slots to C.
        //   d. Set thenFinally and catchFinally's [[OnFinally]] internal slots to onFinally.

        Var thenFinally = nullptr;
        Var catchFinally = nullptr;

        if (args.Info.Count > 1)
        {
            if (JavascriptConversion::IsCallable(args[1]))
            {
                //note to avoid duplicating code the ThenFinallyFunction works as both thenFinally and catchFinally using a flag
                thenFinally = library->CreatePromiseThenFinallyFunction(EntryThenFinallyFunction, VarTo<RecyclableObject>(args[1]), constructor, false);
                catchFinally = library->CreatePromiseThenFinallyFunction(EntryThenFinallyFunction, VarTo<RecyclableObject>(args[1]), constructor, true);
            }
            else
            {
                thenFinally = args[1];
                catchFinally = args[1];
            }
        }
        else
        {
            thenFinally = library->GetUndefined();
            catchFinally = library->GetUndefined();
        }

        Assert(thenFinally != nullptr && catchFinally != nullptr);

        // 7. Return ? Invoke(promise, "then", << thenFinally, catchFinally >>).
        Var funcVar = JavascriptOperators::GetProperty(promise, Js::PropertyIds::then, scriptContext);
        if (!JavascriptConversion::IsCallable(funcVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise.prototype.finally"));
        }
        RecyclableObject* func = UnsafeVarTo<RecyclableObject>(funcVar);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                func, Js::CallInfo(CallFlags_Value, 3),
                promise,
                thenFinally,
                catchFinally);
        }
        END_SAFE_REENTRANT_CALL
    }